

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_local_polynomial.hpp
# Opt level: O1

pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double> * __thiscall
openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::FindMinInteraction
          (pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>
           *__return_storage_ptr__,KLocalPolynomial<openjij::graph::Polynomial<double>_> *this,
          double threshold)

{
  double dVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  runtime_error *prVar2;
  ulong uVar3;
  pointer pvVar4;
  long lVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> min_key;
  double local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  __x = (this->poly_key_list_).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if ((this->poly_key_list_).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == __x) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Interactions are empty.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_58 = *(this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,__x);
  pvVar4 = (this->poly_key_list_).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->poly_key_list_).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar4) {
    lVar5 = 0;
    uVar3 = 0;
    do {
      dVar1 = (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3];
      if ((((dVar1 != 0.0) || (NAN(dVar1))) && (ABS(dVar1) < ABS(local_58))) &&
         (threshold < ABS(dVar1))) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&local_48,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&(pvVar4->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar5));
        local_58 = dVar1;
      }
      uVar3 = uVar3 + 1;
      pvVar4 = (this->poly_key_list_).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x18;
    } while (uVar3 < (ulong)(((long)(this->poly_key_list_).
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3)
                            * -0x5555555555555555));
  }
  if (threshold < ABS(local_58)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&__return_storage_ptr__->first,&local_48);
    __return_storage_ptr__->second = local_58;
    if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"No minimum value in interactions");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::pair<std::vector<graph::Index>, FloatType>
  FindMinInteraction(const FloatType threshold = 0.0) const {
    if (poly_key_list_.size() == 0) {
      throw std::runtime_error("Interactions are empty.");
    }
    FloatType min_val = poly_value_list_[0];
    std::vector<graph::Index> min_key = poly_key_list_[0];
    for (std::size_t i = 0; i < poly_key_list_.size(); ++i) {
      if (poly_value_list_[i] != 0.0 &&
          std::abs(poly_value_list_[i]) < std::abs(min_val) &&
          threshold < std::abs(poly_value_list_[i])) {
        min_val = poly_value_list_[i];
        min_key = poly_key_list_[i];
      }
    }

    if (std::abs(min_val) <= threshold) {
      throw std::runtime_error("No minimum value in interactions");
    }
    return std::pair<std::vector<graph::Index>, FloatType>(min_key, min_val);
  }